

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall pbrt::Image::FlipY(Image *this)

{
  float fVar1;
  uchar uVar2;
  uint16_t uVar3;
  PixelFormat PVar4;
  uchar *puVar5;
  Half *pHVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  iVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  if (1 < iVar10) {
    iVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    iVar9 = -1;
    iVar8 = 0;
    do {
      if (0 < iVar13) {
        sVar12 = (this->channelNames).nStored;
        iVar10 = 0;
        do {
          iVar11 = (int)sVar12;
          if (0 < iVar11) {
            lVar15 = (long)((iVar8 * iVar13 + iVar10) * iVar11);
            lVar14 = (long)((((this->resolution).super_Tuple2<pbrt::Point2,_int>.y + iVar9) * iVar13
                            + iVar10) * iVar11);
            lVar16 = 0;
            do {
              PVar4 = this->format;
              if (PVar4 == Float) {
                pfVar7 = (this->p32).ptr;
                fVar1 = pfVar7[lVar15];
                pfVar7[lVar15] = pfVar7[lVar14];
                pfVar7[lVar14] = fVar1;
              }
              else if (PVar4 == Half) {
                pHVar6 = (this->p16).ptr;
                uVar3 = pHVar6[lVar15].h;
                pHVar6[lVar15].h = pHVar6[lVar14].h;
                pHVar6[lVar14].h = uVar3;
              }
              else {
                if (PVar4 != U256) {
                  LogFatal(Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                           ,0x305,"unexpected format");
                }
                puVar5 = (this->p8).ptr;
                uVar2 = puVar5[lVar15];
                puVar5[lVar15] = puVar5[lVar14];
                puVar5[lVar14] = uVar2;
                sVar12 = (this->channelNames).nStored;
              }
              lVar16 = lVar16 + 1;
              lVar15 = lVar15 + 1;
              lVar14 = lVar14 + 1;
            } while (lVar16 < (int)sVar12);
            iVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar13);
        iVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      }
      iVar8 = iVar8 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar8 < iVar10 / 2);
  }
  return;
}

Assistant:

void Image::FlipY() {
    for (int y = 0; y < resolution.y / 2; ++y) {
        for (int x = 0; x < resolution.x; ++x) {
            size_t o1 = PixelOffset({x, y}), o2 = PixelOffset({x, resolution.y - 1 - y});
            for (int c = 0; c < NChannels(); ++c) {
                if (Is8Bit(format))
                    pstd::swap(p8[o1 + c], p8[o2 + c]);
                else if (Is16Bit(format))
                    pstd::swap(p16[o1 + c], p16[o2 + c]);
                else if (Is32Bit(format))
                    pstd::swap(p32[o1 + c], p32[o2 + c]);
                else
                    LOG_FATAL("unexpected format");
            }
        }
    }
}